

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test7::executeFunctionalTest(GPUShaderFP64Test7 *this,_variables *variables)

{
  uchar *puVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  size_t sVar7;
  int iVar8;
  int iVar9;
  _variable_type type;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  ulong local_1e0;
  string local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  bVar4 = buildTestProgram(this,variables);
  if (bVar4) {
    if (this->m_are_double_inputs_supported == true) {
      setInputAttributeValues(this,variables);
    }
    configureXFBBuffer(this,variables);
    iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar12 = CONCAT44(extraout_var,iVar5);
    (**(code **)(lVar12 + 0x1c0))(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glClearColor() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23df);
    (**(code **)(lVar12 + 0x188))(0x4000);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glClear() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e2);
    (**(code **)(lVar12 + 0x1680))(this->m_po_id);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23e5);
    (**(code **)(lVar12 + 0x1a00))(0,0,this->m_to_width,this->m_to_height);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glViewport() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ea);
    (**(code **)(lVar12 + 0x30))(4);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glBeginTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23ed);
    (**(code **)(lVar12 + 0x538))(0xe,0,4);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f0);
    (**(code **)(lVar12 + 0x638))();
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glEndTransformFeedback() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f3);
    (**(code **)(lVar12 + 0x1220))
              (0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data);
    dVar6 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar6,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x23f9);
    if (this->m_to_height == 0) {
      bVar4 = true;
    }
    else {
      bVar4 = true;
      local_1e0 = 0;
      do {
        bVar15 = this->m_to_width != 0;
        if (bVar15) {
          iVar5 = this->m_to_width * (int)local_1e0;
          puVar1 = this->m_to_data;
          uVar10 = 0;
          do {
            uVar11 = (ulong)(uint)((int)uVar10 * 4);
            if (puVar1[uVar11 + (uint)(iVar5 * 4)] == '\0') {
              iVar8 = puVar1[uVar11 + (ulong)(uint)(iVar5 * 4) + 1] - 0xff;
              iVar9 = -iVar8;
              if (0 < iVar8) {
                iVar9 = iVar8;
              }
              if (((0 < iVar9) || (puVar1[uVar11 + (ulong)(uint)(iVar5 * 4) + 2] != '\0')) ||
                 (puVar1[uVar11 + (ulong)(uint)(iVar5 * 4) + 3] != '\0')) goto LAB_0094dbe9;
              bVar3 = true;
            }
            else {
LAB_0094dbe9:
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Invalid pixel found at (",0x18);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
              std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"); expected:(0, 255, 0, 0), found: (",0x24);
              std::ostream::operator<<
                        ((ostringstream *)&local_1a8,(uint)puVar1[uVar11 + (uint)(iVar5 * 4)]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
              std::ostream::operator<<
                        ((ostringstream *)&local_1a8,
                         (uint)puVar1[uVar11 + (ulong)(uint)(iVar5 * 4) + 1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
              std::ostream::operator<<
                        ((ostringstream *)&local_1a8,
                         (uint)puVar1[uVar11 + (ulong)(uint)(iVar5 * 4) + 2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
              std::ostream::operator<<
                        ((ostringstream *)&local_1a8,
                         (uint)puVar1[uVar11 + (ulong)(uint)(iVar5 * 4) + 3]);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,
                         "), with the following variable types used as varyings:",0x36);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              lVar12 = (long)(variables->
                             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(variables->
                             super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                             )._M_impl.super__Vector_impl_data._M_start;
              if (lVar12 != 0) {
                lVar13 = (lVar12 >> 2) * -0x5555555555555555;
                lVar12 = 0;
                lVar14 = 0;
                do {
                  local_1b0 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,"gs_variable",0xb);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,": ",2);
                  Utils::getVariableTypeString_abi_cxx11_
                            (&local_1d0,
                             (Utils *)(ulong)*(uint *)((long)&((variables->
                                                                                                                              
                                                  super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->type
                                                  + lVar12),type);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,local_1d0._M_dataplus._M_p,
                             local_1d0._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8," (array size:",0xd);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                    operator_delete(local_1d0._M_dataplus._M_p,
                                    local_1d0.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                  std::ios_base::~ios_base(local_138);
                  lVar14 = lVar14 + 1;
                  lVar12 = lVar12 + 0xc;
                } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
              }
              logVariableContents(this,variables);
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Shaders used:\n\n(VS):\n",0x15);
              pcVar2 = (this->m_current_vs_body)._M_dataplus._M_p;
              iVar9 = (int)(ostringstream *)&local_1a8;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear(iVar9 + (int)local_1a8[-3]);
              }
              else {
                sVar7 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,pcVar2,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"(TC):\n\n",7);
              pcVar2 = (this->m_current_tc_body)._M_dataplus._M_p;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear(iVar9 + (int)local_1a8[-3]);
              }
              else {
                sVar7 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,pcVar2,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"\n(TE):\n\n",8);
              pcVar2 = (this->m_current_te_body)._M_dataplus._M_p;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear(iVar9 + (int)local_1a8[-3]);
              }
              else {
                sVar7 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,pcVar2,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"\n(GS):\n",7);
              pcVar2 = (this->m_current_gs_body)._M_dataplus._M_p;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear(iVar9 + (int)local_1a8[-3]);
              }
              else {
                sVar7 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,pcVar2,sVar7);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"\n(FS):\n\n",8);
              pcVar2 = (this->m_current_fs_body)._M_dataplus._M_p;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear(iVar9 + (int)local_1a8[-3]);
              }
              else {
                sVar7 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,pcVar2,sVar7);
              }
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              bVar3 = false;
              bVar4 = false;
            }
            if (!bVar3) break;
            uVar10 = uVar10 + 1;
            bVar15 = uVar10 < this->m_to_width;
          } while (bVar15);
        }
      } while ((!bVar15) && (local_1e0 = local_1e0 + 1, local_1e0 < this->m_to_height));
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool GPUShaderFP64Test7::executeFunctionalTest(_variables& variables)
{
	bool result = true;

	/* Build the test program */
	if (!buildTestProgram(variables))
	{
		return false;
	}

	/* Set up input attributes if GL_ARB_vertex_attrib_64bit extension is supported */
	if (m_are_double_inputs_supported)
	{
		setInputAttributeValues(variables);
	}

	/* Set up buffer object to hold XFB data. The data will be used for logging purposes
	 * only, if a data mismatch is detected.
	 */
	configureXFBBuffer(variables);

	/* Issue a draw call using the test program */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear() call failed.");

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.viewport(0, /* x */
				0, /* y */
				m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_PATCHES, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Verify color attachment contents */
	const float epsilon = 1.0f / 255.0f;

	gl.readPixels(0 /* x */, 0 /* y */, m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

	for (unsigned int y = 0; y < m_to_height; ++y)
	{
		const unsigned char* row_ptr = m_to_data + 4 /* rgba */ * m_to_width * y;

		for (unsigned int x = 0; x < m_to_width; ++x)
		{
			const unsigned char* pixel_ptr = row_ptr + 4 /* rgba */ * x;

			if (de::abs(pixel_ptr[0]) > epsilon || de::abs(pixel_ptr[1] - 255) > epsilon ||
				de::abs(pixel_ptr[2]) > epsilon || de::abs(pixel_ptr[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid pixel found at (" << x << ", " << y
								   << ")"
									  "; expected:(0, 255, 0, 0), found: ("
								   << (int)pixel_ptr[0] << ", " << (int)pixel_ptr[1] << ", " << (int)pixel_ptr[2]
								   << ", " << (int)pixel_ptr[3]
								   << "), with the following variable types used as varyings:"
								   << tcu::TestLog::EndMessage;

				/* List the variable types that failed the test */
				const size_t n_variables = variables.size();

				for (size_t n_variable = 0; n_variable < n_variables; ++n_variable)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "gs_variable" << n_variable << ": "
									   << Utils::getVariableTypeString(variables[n_variable].type)
									   << " (array size:" << variables[n_variable].array_size << ")"
									   << tcu::TestLog::EndMessage;
				} /* for (all variable types) */

				/* Log the variable contents */
				logVariableContents(variables);

				/* Log shaders used for the iteration */
				m_testCtx.getLog() << tcu::TestLog::Message << "Shaders used:\n"
															   "\n"
															   "(VS):\n"
								   << m_current_vs_body.c_str() << "\n"
								   << "(TC):\n"
									  "\n"
								   << m_current_tc_body.c_str() << "\n"
																   "(TE):\n"
																   "\n"
								   << m_current_te_body.c_str() << "\n"
																   "(GS):\n"
								   << m_current_gs_body.c_str() << "\n"
																   "(FS):\n"
																   "\n"
								   << m_current_fs_body.c_str() << tcu::TestLog::EndMessage;

				result = false;

				goto end;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */

/* All done! */
end:
	return result;
}